

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct32_stage8_avx2(__m256i *bf1,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rounding,int bit)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xf],(undefined1  [32])*bf1);
  auVar4 = vpsubd_avx2((undefined1  [32])*bf1,(undefined1  [32])bf1[0xf]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  *bf1 = alVar2;
  bf1[0xf] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xe],(undefined1  [32])bf1[1]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[1],(undefined1  [32])bf1[0xe]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[1] = alVar2;
  bf1[0xe] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xd],(undefined1  [32])bf1[2]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[2],(undefined1  [32])bf1[0xd]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[2] = alVar2;
  bf1[0xd] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xc],(undefined1  [32])bf1[3]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[3],(undefined1  [32])bf1[0xc]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[3] = alVar2;
  bf1[0xc] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xb],(undefined1  [32])bf1[4]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[4],(undefined1  [32])bf1[0xb]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[4] = alVar2;
  bf1[0xb] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[10],(undefined1  [32])bf1[5]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[5],(undefined1  [32])bf1[10]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[5] = alVar2;
  bf1[10] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[9],(undefined1  [32])bf1[6]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[6],(undefined1  [32])bf1[9]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[6] = alVar2;
  bf1[9] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[8],(undefined1  [32])bf1[7]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[7],(undefined1  [32])bf1[8]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[7] = alVar2;
  bf1[8] = alVar3;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x14],(undefined1  [32])*cospim32);
  auVar4 = vpmulld_avx2((undefined1  [32])bf1[0x1b],(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1b],(undefined1  [32])bf1[0x14]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  bf1[0x1b] = alVar3;
  bf1[0x14] = alVar2;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x15],(undefined1  [32])*cospim32);
  auVar4 = vpmulld_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  auVar5 = ZEXT416((uint)bit);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])bf1[0x15]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  bf1[0x1a] = alVar3;
  bf1[0x15] = alVar2;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x16],(undefined1  [32])*cospim32);
  auVar4 = vpmulld_avx2((undefined1  [32])bf1[0x19],(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x19],(undefined1  [32])bf1[0x16]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,auVar5);
  bf1[0x19] = alVar3;
  bf1[0x16] = alVar2;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0x17],(undefined1  [32])*cospim32);
  auVar4 = vpmulld_avx2((undefined1  [32])bf1[0x18],(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x18],(undefined1  [32])bf1[0x17]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  bf1[0x18] = alVar3;
  bf1[0x17] = alVar2;
  return;
}

Assistant:

static inline void idct32_stage8_avx2(__m256i *bf1, const __m256i *cospim32,
                                      const __m256i *cospi32,
                                      const __m256i *clamp_lo,
                                      const __m256i *clamp_hi,
                                      const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  addsub_avx2(bf1[0], bf1[15], bf1 + 0, bf1 + 15, clamp_lo, clamp_hi);
  addsub_avx2(bf1[1], bf1[14], bf1 + 1, bf1 + 14, clamp_lo, clamp_hi);
  addsub_avx2(bf1[2], bf1[13], bf1 + 2, bf1 + 13, clamp_lo, clamp_hi);
  addsub_avx2(bf1[3], bf1[12], bf1 + 3, bf1 + 12, clamp_lo, clamp_hi);
  addsub_avx2(bf1[4], bf1[11], bf1 + 4, bf1 + 11, clamp_lo, clamp_hi);
  addsub_avx2(bf1[5], bf1[10], bf1 + 5, bf1 + 10, clamp_lo, clamp_hi);
  addsub_avx2(bf1[6], bf1[9], bf1 + 6, bf1 + 9, clamp_lo, clamp_hi);
  addsub_avx2(bf1[7], bf1[8], bf1 + 7, bf1 + 8, clamp_lo, clamp_hi);

  temp1 = half_btf_avx2(cospim32, &bf1[20], cospi32, &bf1[27], rounding, bit);
  bf1[27] = half_btf_avx2(cospi32, &bf1[20], cospi32, &bf1[27], rounding, bit);
  bf1[20] = temp1;
  temp2 = half_btf_avx2(cospim32, &bf1[21], cospi32, &bf1[26], rounding, bit);
  bf1[26] = half_btf_avx2(cospi32, &bf1[21], cospi32, &bf1[26], rounding, bit);
  bf1[21] = temp2;
  temp1 = half_btf_avx2(cospim32, &bf1[22], cospi32, &bf1[25], rounding, bit);
  bf1[25] = half_btf_avx2(cospi32, &bf1[22], cospi32, &bf1[25], rounding, bit);
  bf1[22] = temp1;
  temp2 = half_btf_avx2(cospim32, &bf1[23], cospi32, &bf1[24], rounding, bit);
  bf1[24] = half_btf_avx2(cospi32, &bf1[23], cospi32, &bf1[24], rounding, bit);
  bf1[23] = temp2;
}